

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_KillObj(FParser *this)

{
  int damage;
  AActor *target;
  TAngle<double> local_30;
  FName local_24;
  undefined1 local_20 [4];
  TFlags<ActorFlag2,_unsigned_int> local_1c;
  AActor *local_18;
  AActor *mo;
  FParser *this_local;
  
  mo = (AActor *)this;
  if (this->t_argc == 0) {
    local_18 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger);
  }
  else {
    local_18 = actorvalue(this->t_argv);
  }
  if (local_18 != (AActor *)0x0) {
    TFlags<ActorFlag,_unsigned_int>::operator|=(&local_18->flags,MF_SHOOTABLE);
    ::operator|((EnumType)local_20,MF2_INVULNERABLE);
    TFlags<ActorFlag2,_unsigned_int>::operator~(&local_1c);
    TFlags<ActorFlag2,_unsigned_int>::operator&=(&local_18->flags2,&local_1c);
    target = local_18;
    damage = local_18->health;
    FName::FName(&local_24,NAME_Massacre);
    TAngle<double>::TAngle(&local_30,0.0);
    P_DamageMobj(target,(AActor *)0x0,(AActor *)0x0,damage,&local_24,0,&local_30);
  }
  return;
}

Assistant:

void FParser::SF_KillObj(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;  // default to trigger object
	}

	if(mo) 
	{
		// ensure the thing can be killed
		mo->flags|=MF_SHOOTABLE;
		mo->flags2&=~(MF2_INVULNERABLE|MF2_DORMANT);
		// [GrafZahl] This called P_KillMobj directly 
		// which is a very bad thing to do!
		P_DamageMobj(mo, NULL, NULL, mo->health, NAME_Massacre);
	}
}